

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sLongShaderTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Stress::LongShaderCompileStressCase::~LongShaderCompileStressCase
          (LongShaderCompileStressCase *this)

{
  ~LongShaderCompileStressCase(this);
  operator_delete(this,0x120);
  return;
}

Assistant:

LongShaderCompileStressCase::~LongShaderCompileStressCase (void)
{
}